

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall
QPlainTextDocumentLayout::layoutBlock(QPlainTextDocumentLayout *this,QTextBlock *block)

{
  long lVar1;
  QTextDocumentPrivate *pQVar2;
  qreal qVar3;
  char cVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  QTextOption *pQVar9;
  undefined1 *extraout_RDX;
  QTextBlock *this_00;
  long in_FS_OFFSET;
  ulong uVar10;
  double dVar11;
  undefined1 *puVar12;
  double dVar13;
  undefined1 *local_d0;
  double local_c8;
  QTextOption option;
  QFontMetrics fm;
  undefined4 local_60;
  QTextDocumentPrivate *local_58;
  undefined1 *local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  QAbstractTextDocumentLayout::document();
  pQVar2 = (QTextDocumentPrivate *)QTextDocument::documentMargin();
  pQVar9 = (QTextOption *)QTextBlock::layout();
  _option = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::defaultTextOption();
  QTextLayout::setTextOption(pQVar9);
  dVar11 = 0.0;
  if (((ulong)_option & 0x400000000) != 0) {
    _fm = (QTextDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::charFormat();
    QTextCharFormat::font();
    QFontMetrics::QFontMetrics(&fm,(QFont *)local_48);
    QFont::~QFont((QFont *)local_48);
    QTextFormat::~QTextFormat((QTextFormat *)&local_58);
    iVar5 = QFontMetrics::horizontalAdvance((QChar)(char16_t)&fm);
    QFontMetrics::~QFontMetrics(&fm);
    dVar11 = (double)iVar5;
  }
  QTextLayout::beginLayout();
  uVar10 = -(ulong)(0.0 < *(double *)(lVar1 + 0x98));
  puVar12 = (undefined1 *)(dVar11 + (double)pQVar2 + (double)pQVar2);
  dVar13 = (double)(~uVar10 & 0x41dfffffffc00000 | (ulong)*(double *)(lVar1 + 0x98) & uVar10) -
           (double)puVar12;
  local_c8 = 0.0;
  local_d0 = (undefined1 *)0x0;
  dVar11 = local_c8;
  while( true ) {
    local_c8 = dVar11;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uVar6 = QTextLayout::createLine();
    local_48._0_4_ = uVar6;
    local_48._8_8_ = extraout_RDX;
    if (extraout_RDX == (undefined1 *)0x0) break;
    QTextLine::setLeadingIncluded(SUB81((QPointF *)local_48,0));
    QTextLine::setLineWidth(dVar13);
    local_50 = local_d0;
    local_58 = pQVar2;
    QTextLine::setPosition((QPointF *)local_48);
    dVar11 = (double)QTextLine::height();
    local_d0 = (undefined1 *)(dVar11 + (double)local_d0);
    dVar11 = (double)QTextLine::leading();
    puVar12 = (undefined1 *)0x0;
    if (dVar11 < 0.0) {
      dVar11 = (double)QTextLine::leading();
      dVar11 = ceil(dVar11);
      puVar12 = (undefined1 *)((double)local_d0 + (double)(int)dVar11);
      local_d0 = puVar12;
    }
    dVar11 = (double)QTextLine::naturalTextWidth();
    dVar11 = dVar11 + (double)pQVar2 + (double)pQVar2;
    if (dVar11 <= local_c8) {
      dVar11 = local_c8;
    }
  }
  QTextLayout::endLayout();
  iVar5 = QTextDocument::lineCount();
  cVar4 = QTextBlock::isVisible();
  if (cVar4 != '\0') {
    QTextLayout::lineCount();
  }
  QTextBlock::setLineCount((int)block);
  iVar7 = QTextDocument::lineCount();
  if (local_c8 < *(double *)(lVar1 + 0xa0) || local_c8 == *(double *)(lVar1 + 0xa0)) {
    iVar8 = QTextBlock::blockNumber();
    if ((iVar8 == *(int *)(lVar1 + 0xa8)) && (local_c8 < *(double *)(lVar1 + 0xa0))) {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextDocument::firstBlock();
      *(undefined8 *)(lVar1 + 0xa0) = 0;
      local_58 = (QTextDocumentPrivate *)0x0;
      local_50 = (undefined1 *)0xaaaaaaaa00000000;
      while (this_00 = (QTextBlock *)local_48, cVar4 = QTextBlock::isValid(), cVar4 != '\0') {
        qVar3 = blockWidth((QPlainTextDocumentLayout *)this_00,(QTextBlock *)local_48);
        if (*(double *)(lVar1 + 0xa0) <= qVar3 && qVar3 != *(double *)(lVar1 + 0xa0)) {
          *(qreal *)(lVar1 + 0xa0) = qVar3;
          local_58 = (QTextDocumentPrivate *)local_48._0_8_;
          local_50 = (undefined1 *)CONCAT44(local_50._4_4_,local_48._8_4_);
        }
        QTextBlock::next();
        local_48._0_8_ = _fm;
        local_48._8_4_ = local_60;
      }
      cVar4 = QTextBlock::isValid();
      if (cVar4 != '\0') goto LAB_00456455;
    }
    if (iVar5 == iVar7) goto LAB_0045659d;
  }
  else {
    *(double *)(lVar1 + 0xa0) = local_c8;
LAB_00456455:
    uVar6 = QTextBlock::blockNumber();
    *(undefined4 *)(lVar1 + 0xa8) = uVar6;
  }
  if (*(char *)(lVar1 + 0xb9) == '\0') {
    local_48._0_8_ = (**(code **)(*(long *)this + 0x78))(this);
    local_48._8_8_ = puVar12;
    QAbstractTextDocumentLayout::documentSizeChanged((QSizeF *)this);
  }
LAB_0045659d:
  QTextOption::~QTextOption(&option);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextDocumentLayout::layoutBlock(const QTextBlock &block)
{
    Q_D(QPlainTextDocumentLayout);
    QTextDocument *doc = document();
    qreal margin = doc->documentMargin();
    qreal blockMaximumWidth = 0;

    qreal height = 0;
    QTextLayout *tl = block.layout();
    QTextOption option = doc->defaultTextOption();
    tl->setTextOption(option);

    int extraMargin = 0;
    if (option.flags() & QTextOption::AddSpaceForLineAndParagraphSeparators) {
        QFontMetrics fm(block.charFormat().font());
        extraMargin += fm.horizontalAdvance(QChar(0x21B5));
    }
    tl->beginLayout();
    qreal availableWidth = d->width;
    if (availableWidth <= 0) {
        availableWidth = qreal(INT_MAX); // similar to text edit with pageSize.width == 0
    }
    availableWidth -= 2*margin + extraMargin;
    while (1) {
        QTextLine line = tl->createLine();
        if (!line.isValid())
            break;
        line.setLeadingIncluded(true);
        line.setLineWidth(availableWidth);
        line.setPosition(QPointF(margin, height));
        height += line.height();
        if (line.leading() < 0)
            height += qCeil(line.leading());
        blockMaximumWidth = qMax(blockMaximumWidth, line.naturalTextWidth() + 2*margin);
    }
    tl->endLayout();

    int previousLineCount = doc->lineCount();
    const_cast<QTextBlock&>(block).setLineCount(block.isVisible() ? tl->lineCount() : 0);
    int lineCount = doc->lineCount();

    bool emitDocumentSizeChanged = previousLineCount != lineCount;
    if (blockMaximumWidth > d->maximumWidth) {
        // new longest line
        d->maximumWidth = blockMaximumWidth;
        d->maximumWidthBlockNumber = block.blockNumber();
        emitDocumentSizeChanged = true;
    } else if (block.blockNumber() == d->maximumWidthBlockNumber && blockMaximumWidth < d->maximumWidth) {
        // longest line shrinking
        QTextBlock b = doc->firstBlock();
        d->maximumWidth = 0;
        QTextBlock maximumBlock;
        while (b.isValid()) {
            qreal blockMaximumWidth = blockWidth(b);
            if (blockMaximumWidth > d->maximumWidth) {
                d->maximumWidth = blockMaximumWidth;
                maximumBlock = b;
            }
            b = b.next();
        }
        if (maximumBlock.isValid()) {
            d->maximumWidthBlockNumber = maximumBlock.blockNumber();
            emitDocumentSizeChanged = true;
        }
    }
    if (emitDocumentSizeChanged && !d->blockDocumentSizeChanged)
        emit documentSizeChanged(documentSize());
}